

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
IteratedExprTest_Test_Test<PairwiseInfo>::TestBody(IteratedExprTest_Test_Test<PairwiseInfo> *this)

{
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
  other;
  Arg arg_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Builder BVar4;
  AssertionFailure *e_3;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_7;
  AssertionFailure *e_2;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_6;
  AssertionFailure *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Arg arg;
  int i_1;
  iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  Builder builder;
  PairwiseInfo info;
  TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> args;
  ExprFactory factory;
  AssertionResult gtest_ar_;
  Expr e;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  undefined4 in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  ExprFactory *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  Type in_stack_fffffffffffffb6c;
  AssertionResult *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  AssertionResult *in_stack_fffffffffffffbb8;
  AssertHelper *in_stack_fffffffffffffbc0;
  allocator<char> local_2f9;
  string local_2f8 [32];
  AssertionResult local_2d8 [3];
  ExprBase local_2a8;
  byte local_29a;
  allocator<char> local_299;
  string local_298 [32];
  AssertionResult local_278 [3];
  int local_244;
  ExprBase local_240;
  byte local_232;
  allocator<char> local_231;
  string local_230 [32];
  AssertionResult local_210 [2];
  Impl **local_1f0;
  AssertionResult local_1e8 [2];
  ExprBase local_1c8;
  ExprBase local_1c0;
  AssertionResult local_1b8 [2];
  ExprBase local_198;
  AssertionResult local_190;
  ExprBase local_180;
  int local_174;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_170 [3];
  int local_158;
  undefined4 local_154;
  AssertionResult local_150 [2];
  Kind local_130;
  Kind local_12c;
  AssertionResult local_128;
  Impl *local_118;
  undefined8 uStack_110;
  BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69> local_108;
  ExprBase local_100;
  int local_f4;
  Impl *local_f0;
  int local_e8;
  Impl *local_e0;
  int iStack_d8;
  undefined4 uStack_d4;
  TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_c8;
  allocator<char> local_a9 [57];
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  mp::
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
  ::BasicIteratedExpr((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                       *)0x16b574);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (bool)in_stack_fffffffffffffb3f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               in_stack_fffffffffffffba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb5c,
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x16b671);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16b708);
  local_70 = local_10[0].impl_;
  other.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffb54;
  other.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffb50;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb48,other,
             in_stack_fffffffffffffb44);
  std::allocator<char>::allocator();
  mp::BasicExprFactory<std::allocator<char>_>::BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  std::allocator<char>::~allocator(local_a9);
  TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::TestArgs
            (in_stack_fffffffffffffb90,
             (ExprFactory *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  BVar4 = PairwiseInfo::BeginBuild
                    ((PairwiseInfo *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
  local_f0 = BVar4.impl_;
  local_e8 = BVar4.arg_index_;
  local_e0 = local_f0;
  iStack_d8 = local_e8;
  for (local_f4 = ExprInfo<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>,_(mp::expr::Kind)68,_mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
                  ::min_args(); local_f4 < 3; local_f4 = local_f4 + 1) {
    local_100.impl_ =
         (Impl *)TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator[]
                           (&local_c8,local_f4);
    arg_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb64;
    arg_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb60;
    mp::BasicExprFactory<std::allocator<char>_>::
    BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
    ::AddArg((BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
              *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),arg_00);
  }
  uStack_110 = CONCAT44(uStack_d4,iStack_d8);
  local_118 = local_e0;
  BVar4.impl_._4_4_ = in_stack_fffffffffffffb54;
  BVar4.impl_._0_4_ = in_stack_fffffffffffffb50;
  BVar4.arg_index_ = in_stack_fffffffffffffb58;
  BVar4._12_4_ = in_stack_fffffffffffffb5c;
  local_108.super_ExprBase.impl_ =
       (ExprBase)
       PairwiseInfo::EndBuild
                 ((PairwiseInfo *)in_stack_fffffffffffffb48,
                  (ExprFactory *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),BVar4
                 );
  local_10[0].impl_ = (Impl *)local_108.super_ExprBase.impl_;
  local_12c = ExprInfo<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>,_(mp::expr::Kind)68,_mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
              ::kind();
  local_130 = mp::internal::ExprBase::kind((ExprBase *)0x16b930);
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             (Kind *)in_stack_fffffffffffffb48,
             (Kind *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x16b9a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb5c,
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    testing::Message::~Message((Message *)0x16ba0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16ba7c);
  local_154 = 3;
  local_158 = mp::
              BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
              ::num_args((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                          *)0x16ba94);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             (int *)in_stack_fffffffffffffb48,
             (int *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x16bb1e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb5c,
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    testing::Message::~Message((Message *)0x16bb81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16bbf2);
  local_170[0].ptr_ =
       (Impl **)mp::
                BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                         *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  local_174 = 0;
  while (local_174 < 3) {
    local_180.impl_ =
         (Impl *)mp::
                 BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                 ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                        *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                       in_stack_fffffffffffffb64);
    local_198.impl_ =
         (Impl *)TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator[]
                           (&local_c8,local_174);
    testing::internal::EqHelper<false>::
    Compare<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb48,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0x16bcef);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 in_stack_fffffffffffffb5c,
                 (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      testing::Message::~Message((Message *)0x16bd52);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x16bdc3);
    local_1c0.impl_ =
         (Impl *)TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator[]
                           (&local_c8,local_174);
    local_1c8.impl_ =
         (Impl *)mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                 operator*((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                           CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
    testing::internal::EqHelper<false>::
    Compare<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb48,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0x16be79);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 in_stack_fffffffffffffb5c,
                 (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      testing::Message::~Message((Message *)0x16bedc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x16bf47);
    local_174 = local_174 + 1;
    mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
              (local_170);
  }
  local_1f0 = (Impl **)mp::
                       BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                       ::end((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                              *)in_stack_fffffffffffffb48);
  testing::internal::EqHelper<false>::
  Compare<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>,mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
            ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
             in_stack_fffffffffffffb48,
             (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x16c004);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb5c,
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    testing::Message::~Message((Message *)0x16c067);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16c0d8);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_210);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
               (allocator<char> *)in_stack_fffffffffffffb70);
    std::allocator<char>::~allocator(&local_231);
    local_232 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_240.impl_ =
           (Impl *)mp::
                   BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                   ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                          *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                         in_stack_fffffffffffffb64);
    }
    if ((local_232 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffb70,
                 (char (*) [95])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      local_244 = 8;
    }
    else {
      local_244 = 0;
    }
    std::__cxx11::string::~string(local_230);
    if (local_244 != 0) goto LAB_0016c445;
  }
  else {
LAB_0016c445:
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x16c461);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb5c,
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    testing::Message::~Message((Message *)0x16c4c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16c535);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
               (allocator<char> *)in_stack_fffffffffffffb70);
    std::allocator<char>::~allocator(&local_299);
    local_29a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_2a8.impl_ =
           (Impl *)mp::
                   BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                   ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                          *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                         in_stack_fffffffffffffb64);
    }
    if ((local_29a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffb70,
                 (char (*) [101])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      local_244 = 9;
    }
    else {
      local_244 = 0;
    }
    std::__cxx11::string::~string(local_298);
    if (local_244 != 0) goto LAB_0016c89c;
  }
  else {
LAB_0016c89c:
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x16c8b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb5c,
               (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    testing::Message::~Message((Message *)0x16c915);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16c986);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
               (allocator<char> *)in_stack_fffffffffffffb70);
    std::allocator<char>::~allocator(&local_2f9);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ExprInfo<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>,_(mp::expr::Kind)68,_mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
      ::min_args();
      PairwiseInfo::BeginBuild
                ((PairwiseInfo *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffb70,
               (char (*) [131])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    local_244 = 10;
    std::__cxx11::string::~string(local_2f8);
    if (local_244 == 0) goto LAB_0016cdba;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffb70);
  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x16ccfc);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
             (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (int)((ulong)pcVar3 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  testing::Message::~Message((Message *)0x16cd59);
LAB_0016cdba:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16cdc7);
  iVar2 = ExprInfo<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>,_(mp::expr::Kind)68,_mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
          ::min_args();
  BVar4 = PairwiseInfo::BeginBuild
                    ((PairwiseInfo *)CONCAT44(iVar2,in_stack_fffffffffffffb50),
                     in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(BVar4.arg_index_,in_stack_fffffffffffffb40));
  return;
}

Assistant:

TYPED_TEST(IteratedExprTest, Test) {
  typename TypeParam::Expr e;
  EXPECT_TRUE(e == 0);
  (void)typename TypeParam::Base(e);
  ExprFactory factory;
  enum {NUM_ARGS = 3};
  TestArgs<typename TypeParam::Arg> args(factory);
  auto info = this->info_;
  typename TypeParam::Builder builder = info.BeginBuild(factory, NUM_ARGS);
  for (int i = info.min_args(); i < NUM_ARGS; ++i)
    builder.AddArg(args[i]);
  e = info.EndBuild(factory, builder);
  EXPECT_EQ(info.kind(), e.kind());
  EXPECT_EQ(3, e.num_args());
  typename TypeParam::Expr::iterator it = e.begin();
  for (int i = 0; i < NUM_ARGS; ++i, ++it) {
    typename TypeParam::Arg arg = e.arg(i);
    EXPECT_EQ(args[i], arg);
    EXPECT_EQ(args[i], *it);
  }
  EXPECT_EQ(e.end(), it);
  EXPECT_ASSERT(e.arg(-1), "index out of bounds");
  EXPECT_ASSERT(e.arg(NUM_ARGS), "index out of bounds");
  EXPECT_ASSERT(info.BeginBuild(factory, info.min_args() - 1),
                "invalid number of arguments");
  info.BeginBuild(factory, info.min_args());
}